

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_6bytes.cpp
# Opt level: O1

Sketch * ConstructGeneric6Bytes(int bits,int implementation)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (Sketch *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

Sketch* ConstructGeneric6Bytes(int bits, int implementation)
{
    switch (bits) {
#ifdef ENABLE_FIELD_INT_41
    case 41: return new SketchImpl<Field41>(implementation, 41);
#endif
#ifdef ENABLE_FIELD_INT_42
    case 42: return new SketchImpl<Field42>(implementation, 42);
#endif
#ifdef ENABLE_FIELD_INT_43
    case 43: return new SketchImpl<Field43>(implementation, 43);
#endif
#ifdef ENABLE_FIELD_INT_44
    case 44: return new SketchImpl<Field44>(implementation, 44);
#endif
#ifdef ENABLE_FIELD_INT_45
    case 45: return new SketchImpl<Field45>(implementation, 45);
#endif
#ifdef ENABLE_FIELD_INT_46
    case 46: return new SketchImpl<Field46>(implementation, 46);
#endif
#ifdef ENABLE_FIELD_INT_47
    case 47: return new SketchImpl<Field47>(implementation, 47);
#endif
#ifdef ENABLE_FIELD_INT_48
    case 48: return new SketchImpl<Field48>(implementation, 48);
#endif
    default: return nullptr;
    }
}